

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afhints.c
# Opt level: O2

FT_Error af_glyph_hints_reload(AF_GlyphHints hints,FT_Outline *outline)

{
  char cVar1;
  short sVar2;
  FT_Memory memory;
  FT_Fixed FVar3;
  FT_Fixed FVar4;
  FT_Vector *pFVar5;
  FT_Pos FVar6;
  FT_Pos FVar7;
  byte bVar8;
  ushort uVar9;
  FT_Orientation FVar10;
  AF_Point_conflict *ppAVar11;
  AF_Point_conflict pAVar12;
  short *psVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  FT_Pos *pFVar17;
  uint uVar18;
  FT_Vector *pFVar19;
  FT_UShort FVar20;
  uint uVar21;
  long lVar22;
  long lVar23;
  byte *pbVar24;
  AF_Point_conflict *ppAVar25;
  long lVar26;
  long lVar27;
  short sVar28;
  AF_Point_conflict pAVar29;
  int iVar30;
  uint uVar31;
  AF_Point pAVar32;
  uint uVar33;
  FT_Int FVar34;
  AF_Point_conflict pAVar35;
  AF_Point_conflict pAVar36;
  AF_Point pAVar37;
  bool bVar38;
  FT_Error error;
  FT_Outline *local_70;
  AF_Point_conflict *local_68;
  AF_Point_conflict *local_60;
  long local_58;
  AF_Point_conflict local_50;
  AF_Point_conflict local_48;
  AF_GlyphHints local_40;
  long local_38;
  
  error = 0;
  memory = hints->memory;
  FVar3 = hints->x_scale;
  FVar4 = hints->y_scale;
  local_60 = (AF_Point_conflict *)hints->x_delta;
  local_68 = (AF_Point_conflict *)hints->y_delta;
  hints->num_points = 0;
  hints->num_contours = 0;
  hints->axis[0].num_segments = 0;
  hints->axis[0].num_edges = 0;
  hints->axis[1].num_segments = 0;
  hints->axis[1].num_edges = 0;
  uVar33 = (uint)outline->n_contours;
  local_70 = outline;
  if (uVar33 < 9) {
    if (hints->contours != (AF_Point_conflict *)0x0) goto LAB_00179f71;
    hints->contours = (hints->embedded).contours;
    uVar33 = 8;
  }
  else {
    if (uVar33 <= (uint)hints->max_contours) goto LAB_00179f71;
    ppAVar11 = hints->contours;
    if ((anon_struct_7744_2_b586ae8f_for_embedded *)ppAVar11 == &hints->embedded) {
      hints->contours = (AF_Point_conflict *)0x0;
      ppAVar11 = (AF_Point_conflict *)0x0;
    }
    uVar33 = uVar33 + 3 & 0xfffffffc;
    ppAVar11 = (AF_Point_conflict *)
               ft_mem_realloc(memory,8,(ulong)(uint)hints->max_contours,(ulong)uVar33,ppAVar11,
                              &error);
    hints->contours = ppAVar11;
    if (error != 0) {
      return error;
    }
  }
  hints->max_contours = uVar33;
LAB_00179f71:
  FVar34 = (FT_Int)local_70->n_points;
  if (FVar34 + 2U < 0x61) {
    if (hints->points == (AF_Point_conflict)0x0) {
      hints->points = (hints->embedded).points;
      hints->max_points = 0x60;
    }
  }
  else if ((uint)hints->max_points < FVar34 + 2U) {
    pAVar12 = hints->points;
    if (pAVar12 == (hints->embedded).points) {
      hints->points = (AF_Point_conflict)0x0;
      pAVar12 = (AF_Point_conflict)0x0;
    }
    uVar33 = FVar34 + 0xbU & 0xfffffff8;
    pAVar12 = (AF_Point_conflict)
              ft_mem_realloc(memory,0x50,(ulong)(uint)hints->max_points,(ulong)uVar33,pAVar12,&error
                            );
    hints->points = pAVar12;
    if (error != 0) {
      return error;
    }
    hints->max_points = uVar33;
    FVar34 = (FT_Int)local_70->n_points;
  }
  hints->num_points = FVar34;
  hints->num_contours = (int)local_70->n_contours;
  hints->axis[0].major_dir = AF_DIR_UP;
  hints->axis[1].major_dir = AF_DIR_LEFT;
  FVar10 = FT_Outline_Get_Orientation(local_70);
  if (FVar10 == FT_ORIENTATION_FILL_LEFT) {
    hints->axis[0].major_dir = AF_DIR_DOWN;
    hints->axis[1].major_dir = AF_DIR_RIGHT;
  }
  hints->x_scale = FVar3;
  hints->y_scale = FVar4;
  hints->x_delta = (FT_Pos)local_60;
  hints->y_delta = (FT_Pos)local_68;
  hints->xmin_delta = 0;
  hints->xmax_delta = 0;
  if ((long)hints->num_points != 0) {
    pAVar12 = hints->points;
    local_48 = pAVar12 + hints->num_points;
    uVar33 = (uint)((hints->metrics->scaler).face)->units_per_EM * 0x14 >> 0xb;
    pFVar5 = local_70->points;
    pbVar24 = (byte *)local_70->tags;
    psVar13 = local_70->contours;
    lVar27 = (long)*psVar13;
    pAVar29 = pAVar12 + lVar27;
    local_38 = (long)(int)FVar4;
    iVar30 = 0;
    pFVar19 = pFVar5;
    pAVar36 = pAVar29;
    for (pAVar35 = pAVar12; pAVar35 < local_48; pAVar35 = pAVar35 + 1) {
      pAVar35->in_dir = '\x04';
      pAVar35->out_dir = '\x04';
      FVar6 = pFVar19->x;
      pAVar35->fx = (FT_Short)FVar6;
      FVar7 = pFVar19->y;
      pAVar35->fy = (FT_Short)FVar7;
      lVar22 = (long)(int)FVar6 * (long)(int)FVar3;
      lVar22 = (long)(int)((ulong)(lVar22 + 0x8000 + (lVar22 >> 0x3f)) >> 0x10) + (long)local_60;
      pAVar35->x = lVar22;
      pAVar35->ox = lVar22;
      lVar22 = (int)FVar7 * local_38;
      lVar22 = (long)(int)((ulong)(lVar22 + 0x8000 + (lVar22 >> 0x3f)) >> 0x10) + (long)local_68;
      pAVar35->y = lVar22;
      pAVar35->oy = lVar22;
      pAVar29->fx = (FT_Short)pFVar5[(short)lVar27].x;
      pAVar29->fy = (FT_Short)pFVar5[(short)lVar27].y;
      FVar20 = (ushort)((*pbVar24 & 3) == 2) * 2;
      if ((*pbVar24 & 3) == 0) {
        FVar20 = 1;
      }
      pAVar35->flags = FVar20;
      uVar31 = (int)pAVar35->fx - (int)pAVar36->fx;
      uVar18 = -uVar31;
      if (0 < (int)uVar31) {
        uVar18 = uVar31;
      }
      uVar21 = (int)pAVar35->fy - (int)pAVar36->fy;
      uVar31 = -uVar21;
      if (0 < (int)uVar21) {
        uVar31 = uVar21;
      }
      if ((uVar31 & 0xffff) + (uVar18 & 0xffff) < uVar33) {
        *(byte *)&pAVar36->flags = (byte)pAVar36->flags | 0x20;
      }
      pAVar35->prev = pAVar36;
      pAVar36->next = pAVar35;
      pAVar36 = pAVar35;
      if ((pAVar35 == pAVar29) &&
         (iVar30 = iVar30 + 1, pAVar36 = pAVar29, iVar30 < local_70->n_contours)) {
        lVar27 = (long)psVar13[iVar30];
        pAVar29 = pAVar12 + lVar27;
        pAVar36 = pAVar29;
      }
      pFVar19 = pFVar19 + 1;
      pbVar24 = pbVar24 + 1;
    }
    ppAVar25 = hints->contours;
    iVar30 = hints->num_contours;
    ppAVar11 = ppAVar25 + iVar30;
    sVar28 = 0;
    for (; ppAVar25 < ppAVar11; ppAVar25 = ppAVar25 + 1) {
      *ppAVar25 = pAVar12 + sVar28;
      sVar28 = *psVar13 + 1;
      psVar13 = psVar13 + 1;
    }
    local_68 = hints->contours + iVar30;
    local_58 = (long)(int)(uVar33 * 2 + -1);
    ppAVar11 = hints->contours;
    while (ppAVar25 = ppAVar11, ppAVar25 < local_68) {
      pAVar32 = *ppAVar25;
      do {
        pAVar35 = pAVar32;
        pAVar32 = pAVar35->prev;
        uVar14 = (ulong)(ushort)pAVar35->fx;
        if (pAVar32 == *ppAVar25) {
          uVar18 = (uint)(ushort)pAVar35->fy;
          break;
        }
        lVar22 = (long)pAVar35->fx - (long)pAVar32->fx;
        uVar18 = (uint)pAVar35->fy;
        lVar27 = -lVar22;
        if (0 < lVar22) {
          lVar27 = lVar22;
        }
        uVar21 = uVar18 - (int)pAVar32->fy;
        uVar31 = -uVar21;
        if (0 < (int)uVar21) {
          uVar31 = uVar21;
        }
      } while ((long)(((ulong)uVar31 & 0xffff) + lVar27) < local_58);
      pAVar35->u = 0;
      pAVar35->v = 0;
      lVar27 = 0;
      lVar22 = 0;
      pAVar32 = pAVar35;
      pAVar37 = pAVar35;
      do {
        pAVar32 = pAVar32->next;
        sVar28 = pAVar32->fx;
        lVar27 = ((long)sVar28 - (long)(short)uVar14) + lVar27;
        sVar2 = pAVar32->fy;
        lVar22 = ((long)sVar2 - (long)(short)uVar18) + lVar22;
        lVar23 = -lVar27;
        lVar16 = lVar27;
        if (lVar27 < 1) {
          lVar16 = lVar23;
        }
        lVar26 = lVar22;
        if (lVar22 < 1) {
          lVar26 = -lVar22;
        }
        if ((ulong)(lVar26 + lVar16) < (ulong)uVar33) {
          *(byte *)&pAVar32->flags = (byte)pAVar32->flags | 0x10;
        }
        else {
          lVar15 = ((long)pAVar32 - (long)pAVar37) / 0x50;
          pAVar37->u = lVar15;
          pAVar32->v = -lVar15;
          if (lVar22 < lVar27) {
            bVar8 = 1;
            lVar15 = lVar27;
            if (SBORROW8(lVar22,lVar23) != lVar22 + lVar27 < 0) {
              bVar8 = 0xfe;
              lVar15 = -lVar22;
              lVar26 = lVar16;
            }
          }
          else {
            bVar38 = -lVar22 != lVar27;
            lVar15 = lVar22;
            if (bVar38 && lVar22 <= lVar23) {
              lVar27 = lVar22;
              lVar15 = lVar23;
            }
            bVar8 = -(bVar38 && lVar22 <= lVar23) | 2;
            lVar26 = -lVar27;
            if (0 < lVar27) {
              lVar26 = lVar27;
            }
          }
          if (lVar15 == lVar26 * 0xe || SBORROW8(lVar15,lVar26 * 0xe) != lVar15 + lVar26 * -0xe < 0)
          {
            bVar8 = 4;
          }
          while( true ) {
            pAVar37->out_dir = bVar8;
            pAVar37 = pAVar37->next;
            if (pAVar37 == pAVar32) break;
            pAVar37->in_dir = bVar8;
          }
          pAVar32->in_dir = bVar8;
          lVar27 = ((long)pAVar35 - (long)pAVar32) / 0x50;
          pAVar37->u = lVar27;
          pAVar35->v = -lVar27;
          lVar27 = 0;
          lVar22 = 0;
        }
        uVar18 = (uint)sVar2;
        uVar14 = (long)sVar28 & 0xffffffff;
      } while (pAVar32 != pAVar35);
      local_60 = ppAVar25;
      ppAVar11 = ppAVar25 + 1;
    }
    for (pFVar17 = &pAVar12->u; local_50 = pAVar12, local_40 = hints,
        (AF_Point_conflict)(pFVar17 + -6) < local_48; pFVar17 = pFVar17 + 10) {
      uVar9 = ((AF_Point_conflict)(pFVar17 + -6))->flags;
      if ((((uVar9 & 0x10) == 0) && (*(FT_Char *)((long)pFVar17 + -0x2e) == '\x04')) &&
         (*(FT_Char *)((long)pFVar17 + -0x2d) == '\x04')) {
        lVar27 = *pFVar17;
        lVar22 = pFVar17[1];
        if ((-1 < ((int)*(short *)(pFVar17 + -3) - (int)(short)pFVar17[lVar22 * 10 + -3] ^
                  (int)(short)pFVar17[lVar27 * 10 + -3] - (int)*(short *)(pFVar17 + -3))) &&
           (-1 < ((int)*(FT_Short *)((long)pFVar17 + -0x16) -
                  (int)*(short *)((long)pFVar17 + lVar22 * 0x50 + -0x16) ^
                 (int)*(short *)((long)pFVar17 + lVar27 * 0x50 + -0x16) -
                 (int)*(FT_Short *)((long)pFVar17 + -0x16)))) {
          ((AF_PointRec_ *)(pFVar17 + -6))->flags = uVar9 | 0x10;
          lVar16 = (lVar27 * 0x50 + lVar22 * -0x50) / 0x50;
          pFVar17[lVar22 * 10] = lVar16;
          pFVar17[lVar27 * 10 + 1] = -lVar16;
        }
      }
    }
    for (; pAVar12 < local_48; pAVar12 = pAVar12 + 1) {
      uVar9 = pAVar12->flags;
      if ((uVar9 & 0x10) == 0) {
        if ((uVar9 & 3) == 0) {
          cVar1 = pAVar12->out_dir;
          if (cVar1 == pAVar12->in_dir) {
            if (cVar1 == '\x04') {
              lVar27 = pAVar12->u;
              lVar22 = pAVar12->v;
              FVar34 = ft_corner_is_flat((long)pAVar12->fx - (long)pAVar12[lVar22].fx,
                                         (long)pAVar12->fy - (long)pAVar12[lVar22].fy,
                                         (long)pAVar12[lVar27].fx - (long)pAVar12->fx,
                                         (long)pAVar12[lVar27].fy - (long)pAVar12->fy);
              if (FVar34 == 0) goto LAB_0017a4b6;
              lVar16 = (lVar27 * 0x50 + lVar22 * -0x50) / 0x50;
              pAVar12[lVar22].u = lVar16;
              pAVar12[lVar27].v = -lVar16;
              uVar9 = pAVar12->flags;
            }
          }
          else if ((int)pAVar12->in_dir + (int)cVar1 != 0) goto LAB_0017a4b6;
        }
        pAVar12->flags = uVar9 | 0x10;
      }
LAB_0017a4b6:
    }
  }
  return error;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  af_glyph_hints_reload( AF_GlyphHints  hints,
                         FT_Outline*    outline )
  {
    FT_Error   error   = FT_Err_Ok;
    AF_Point   points;
    FT_UInt    old_max, new_max;
    FT_Fixed   x_scale = hints->x_scale;
    FT_Fixed   y_scale = hints->y_scale;
    FT_Pos     x_delta = hints->x_delta;
    FT_Pos     y_delta = hints->y_delta;
    FT_Memory  memory  = hints->memory;


    hints->num_points   = 0;
    hints->num_contours = 0;

    hints->axis[0].num_segments = 0;
    hints->axis[0].num_edges    = 0;
    hints->axis[1].num_segments = 0;
    hints->axis[1].num_edges    = 0;

    /* first of all, reallocate the contours array if necessary */
    new_max = (FT_UInt)outline->n_contours;
    old_max = (FT_UInt)hints->max_contours;

    if ( new_max <= AF_CONTOURS_EMBEDDED )
    {
      if ( !hints->contours )
      {
        hints->contours     = hints->embedded.contours;
        hints->max_contours = AF_CONTOURS_EMBEDDED;
      }
    }
    else if ( new_max > old_max )
    {
      if ( hints->contours == hints->embedded.contours )
        hints->contours = NULL;

      new_max = ( new_max + 3 ) & ~3U; /* round up to a multiple of 4 */

      if ( FT_RENEW_ARRAY( hints->contours, old_max, new_max ) )
        goto Exit;

      hints->max_contours = (FT_Int)new_max;
    }

    /*
     *  then reallocate the points arrays if necessary --
     *  note that we reserve two additional point positions, used to
     *  hint metrics appropriately
     */
    new_max = (FT_UInt)( outline->n_points + 2 );
    old_max = (FT_UInt)hints->max_points;

    if ( new_max <= AF_POINTS_EMBEDDED )
    {
      if ( !hints->points )
      {
        hints->points     = hints->embedded.points;
        hints->max_points = AF_POINTS_EMBEDDED;
      }
    }
    else if ( new_max > old_max )
    {
      if ( hints->points == hints->embedded.points )
        hints->points = NULL;

      new_max = ( new_max + 2 + 7 ) & ~7U; /* round up to a multiple of 8 */

      if ( FT_RENEW_ARRAY( hints->points, old_max, new_max ) )
        goto Exit;

      hints->max_points = (FT_Int)new_max;
    }

    hints->num_points   = outline->n_points;
    hints->num_contours = outline->n_contours;

    /* We can't rely on the value of `FT_Outline.flags' to know the fill   */
    /* direction used for a glyph, given that some fonts are broken (e.g., */
    /* the Arphic ones).  We thus recompute it each time we need to.       */
    /*                                                                     */
    hints->axis[AF_DIMENSION_HORZ].major_dir = AF_DIR_UP;
    hints->axis[AF_DIMENSION_VERT].major_dir = AF_DIR_LEFT;

    if ( FT_Outline_Get_Orientation( outline ) == FT_ORIENTATION_POSTSCRIPT )
    {
      hints->axis[AF_DIMENSION_HORZ].major_dir = AF_DIR_DOWN;
      hints->axis[AF_DIMENSION_VERT].major_dir = AF_DIR_RIGHT;
    }

    hints->x_scale = x_scale;
    hints->y_scale = y_scale;
    hints->x_delta = x_delta;
    hints->y_delta = y_delta;

    hints->xmin_delta = 0;
    hints->xmax_delta = 0;

    points = hints->points;
    if ( hints->num_points == 0 )
      goto Exit;

    {
      AF_Point  point;
      AF_Point  point_limit = points + hints->num_points;

      /* value 20 in `near_limit' is heuristic */
      FT_UInt  units_per_em = hints->metrics->scaler.face->units_per_EM;
      FT_Int   near_limit   = 20 * units_per_em / 2048;


      /* compute coordinates & Bezier flags, next and prev */
      {
        FT_Vector*  vec           = outline->points;
        char*       tag           = outline->tags;
        FT_Short    endpoint      = outline->contours[0];
        AF_Point    end           = points + endpoint;
        AF_Point    prev          = end;
        FT_Int      contour_index = 0;


        for ( point = points; point < point_limit; point++, vec++, tag++ )
        {
          FT_Pos  out_x, out_y;


          point->in_dir  = (FT_Char)AF_DIR_NONE;
          point->out_dir = (FT_Char)AF_DIR_NONE;

          point->fx = (FT_Short)vec->x;
          point->fy = (FT_Short)vec->y;
          point->ox = point->x = FT_MulFix( vec->x, x_scale ) + x_delta;
          point->oy = point->y = FT_MulFix( vec->y, y_scale ) + y_delta;

          end->fx = (FT_Short)outline->points[endpoint].x;
          end->fy = (FT_Short)outline->points[endpoint].y;

          switch ( FT_CURVE_TAG( *tag ) )
          {
          case FT_CURVE_TAG_CONIC:
            point->flags = AF_FLAG_CONIC;
            break;
          case FT_CURVE_TAG_CUBIC:
            point->flags = AF_FLAG_CUBIC;
            break;
          default:
            point->flags = AF_FLAG_NONE;
          }

          out_x = point->fx - prev->fx;
          out_y = point->fy - prev->fy;

          if ( FT_ABS( out_x ) + FT_ABS( out_y ) < near_limit )
            prev->flags |= AF_FLAG_NEAR;

          point->prev = prev;
          prev->next  = point;
          prev        = point;

          if ( point == end )
          {
            if ( ++contour_index < outline->n_contours )
            {
              endpoint = outline->contours[contour_index];
              end      = points + endpoint;
              prev     = end;
            }
          }
        }
      }

      /* set up the contours array */
      {
        AF_Point*  contour       = hints->contours;
        AF_Point*  contour_limit = contour + hints->num_contours;
        short*     end           = outline->contours;
        short      idx           = 0;


        for ( ; contour < contour_limit; contour++, end++ )
        {
          contour[0] = points + idx;
          idx        = (short)( end[0] + 1 );
        }
      }

      {
        /*
         *  Compute directions of `in' and `out' vectors.
         *
         *  Note that distances between points that are very near to each
         *  other are accumulated.  In other words, the auto-hinter either
         *  prepends the small vectors between near points to the first
         *  non-near vector, or the sum of small vector lengths exceeds a
         *  threshold, thus `grouping' the small vectors.  All intermediate
         *  points are tagged as weak; the directions are adjusted also to
         *  be equal to the accumulated one.
         */

        FT_Int  near_limit2 = 2 * near_limit - 1;

        AF_Point*  contour;
        AF_Point*  contour_limit = hints->contours + hints->num_contours;


        for ( contour = hints->contours; contour < contour_limit; contour++ )
        {
          AF_Point  first = *contour;
          AF_Point  next, prev, curr;

          FT_Pos  out_x, out_y;


          /* since the first point of a contour could be part of a */
          /* series of near points, go backwards to find the first */
          /* non-near point and adjust `first'                     */

          point = first;
          prev  = first->prev;

          while ( prev != first )
          {
            out_x = point->fx - prev->fx;
            out_y = point->fy - prev->fy;

            /*
             *  We use Taxicab metrics to measure the vector length.
             *
             *  Note that the accumulated distances so far could have the
             *  opposite direction of the distance measured here.  For this
             *  reason we use `near_limit2' for the comparison to get a
             *  non-near point even in the worst case.
             */
            if ( FT_ABS( out_x ) + FT_ABS( out_y ) >= near_limit2 )
              break;

            point = prev;
            prev  = prev->prev;
          }

          /* adjust first point */
          first = point;

          /* now loop over all points of the contour to get */
          /* `in' and `out' vector directions               */

          curr = first;

          /*
           *  We abuse the `u' and `v' fields to store index deltas to the
           *  next and previous non-near point, respectively.
           *
           *  To avoid problems with not having non-near points, we point to
           *  `first' by default as the next non-near point.
           *
           */
          curr->u  = (FT_Pos)( first - curr );
          first->v = -curr->u;

          out_x = 0;
          out_y = 0;

          next = first;
          do
          {
            AF_Direction  out_dir;


            point = next;
            next  = point->next;

            out_x += next->fx - point->fx;
            out_y += next->fy - point->fy;

            if ( FT_ABS( out_x ) + FT_ABS( out_y ) < near_limit )
            {
              next->flags |= AF_FLAG_WEAK_INTERPOLATION;
              continue;
            }

            curr->u = (FT_Pos)( next - curr );
            next->v = -curr->u;

            out_dir = af_direction_compute( out_x, out_y );

            /* adjust directions for all points inbetween; */
            /* the loop also updates position of `curr'    */
            curr->out_dir = (FT_Char)out_dir;
            for ( curr = curr->next; curr != next; curr = curr->next )
            {
              curr->in_dir  = (FT_Char)out_dir;
              curr->out_dir = (FT_Char)out_dir;
            }
            next->in_dir = (FT_Char)out_dir;

            curr->u  = (FT_Pos)( first - curr );
            first->v = -curr->u;

            out_x = 0;
            out_y = 0;

          } while ( next != first );
        }

        /*
         *  The next step is to `simplify' an outline's topology so that we
         *  can identify local extrema more reliably: A series of
         *  non-horizontal or non-vertical vectors pointing into the same
         *  quadrant are handled as a single, long vector.  From a
         *  topological point of the view, the intermediate points are of no
         *  interest and thus tagged as weak.
         */

        for ( point = points; point < point_limit; point++ )
        {
          if ( point->flags & AF_FLAG_WEAK_INTERPOLATION )
            continue;

          if ( point->in_dir  == AF_DIR_NONE &&
               point->out_dir == AF_DIR_NONE )
          {
            /* check whether both vectors point into the same quadrant */

            FT_Pos  in_x, in_y;
            FT_Pos  out_x, out_y;

            AF_Point  next_u = point + point->u;
            AF_Point  prev_v = point + point->v;


            in_x = point->fx - prev_v->fx;
            in_y = point->fy - prev_v->fy;

            out_x = next_u->fx - point->fx;
            out_y = next_u->fy - point->fy;

            if ( ( in_x ^ out_x ) >= 0 && ( in_y ^ out_y ) >= 0 )
            {
              /* yes, so tag current point as weak */
              /* and update index deltas           */

              point->flags |= AF_FLAG_WEAK_INTERPOLATION;

              prev_v->u = (FT_Pos)( next_u - prev_v );
              next_u->v = -prev_v->u;
            }
          }
        }

        /*
         *  Finally, check for remaining weak points.  Everything else not
         *  collected in edges so far is then implicitly classified as strong
         *  points.
         */

        for ( point = points; point < point_limit; point++ )
        {
          if ( point->flags & AF_FLAG_WEAK_INTERPOLATION )
            continue;

          if ( point->flags & AF_FLAG_CONTROL )
          {
            /* control points are always weak */
          Is_Weak_Point:
            point->flags |= AF_FLAG_WEAK_INTERPOLATION;
          }
          else if ( point->out_dir == point->in_dir )
          {
            if ( point->out_dir != AF_DIR_NONE )
            {
              /* current point lies on a horizontal or          */
              /* vertical segment (but doesn't start or end it) */
              goto Is_Weak_Point;
            }

            {
              AF_Point  next_u = point + point->u;
              AF_Point  prev_v = point + point->v;


              if ( ft_corner_is_flat( point->fx  - prev_v->fx,
                                      point->fy  - prev_v->fy,
                                      next_u->fx - point->fx,
                                      next_u->fy - point->fy ) )
              {
                /* either the `in' or the `out' vector is much more  */
                /* dominant than the other one, so tag current point */
                /* as weak and update index deltas                   */

                prev_v->u = (FT_Pos)( next_u - prev_v );
                next_u->v = -prev_v->u;

                goto Is_Weak_Point;
              }
            }
          }
          else if ( point->in_dir == -point->out_dir )
          {
            /* current point forms a spike */
            goto Is_Weak_Point;
          }
        }
      }
    }

  Exit:
    return error;
  }